

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O2

Vec_Int_t * Gia_ManSimDeriveResets(Gia_Man_t *pGia)

{
  uint uVar1;
  int iVar2;
  int i;
  abctime aVar3;
  Vec_Int_t *p;
  Vec_Int_t *pVVar4;
  Gia_Obj_t *pGVar5;
  abctime aVar6;
  int Addition;
  int Addition_00;
  abctime time;
  uint nCap;
  char *pStr;
  int i_00;
  int iVar7;
  uint uVar8;
  uint local_4c;
  uint local_48;
  uint local_44;
  
  aVar3 = Abc_Clock();
  iVar7 = pGia->nObjs;
  nCap = iVar7 * 2;
  p = Vec_IntAlloc(nCap);
  p->nSize = nCap;
  memset(p->pArray,0,(long)iVar7 << 3);
  pVVar4 = Vec_IntAlloc(1000);
  for (iVar7 = 0; iVar7 < pGia->nRegs; iVar7 = iVar7 + 1) {
    pGVar5 = Gia_ManCo(pGia,(iVar7 - pGia->nRegs) + pGia->vCos->nSize);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    uVar1 = Gia_ObjId(pGia,pGVar5);
    uVar8 = (uint)*(ulong *)pGVar5;
    if (uVar1 != (uVar8 & 0x1fffffff)) {
      iVar2 = Gia_ObjToLit(pGia,(Gia_Obj_t *)
                                ((ulong)(uVar8 >> 0x1d & 1) ^
                                (ulong)(pGVar5 + -(*(ulong *)pGVar5 & 0x1fffffff))));
      Vec_IntAddToEntry(p,iVar2,Addition);
      Gia_ManSimCollect(pGia,pGVar5 + -(*(ulong *)pGVar5 & 0x1fffffff),pVVar4);
      i_00 = 0;
      iVar2 = pVVar4->nSize;
      if (pVVar4->nSize < 1) {
        iVar2 = i_00;
      }
      for (; iVar2 != i_00; i_00 = i_00 + 1) {
        i = Vec_IntEntry(pVVar4,i_00);
        Vec_IntAddToEntry(p,i,Addition_00);
      }
    }
  }
  Vec_IntFree(pVVar4);
  iVar7 = pGia->nObjs;
  pVVar4 = Vec_IntAlloc(iVar7);
  pVVar4->nSize = iVar7;
  memset(pVVar4->pArray,0xff,(long)iVar7 << 2);
  uVar1 = 0;
  if ((int)nCap < 1) {
    nCap = 0;
  }
  local_44 = 0;
  local_4c = 0;
  uVar8 = 0;
  local_48 = 0;
  for (; nCap != uVar1; uVar1 = uVar1 + 1) {
    iVar7 = Vec_IntEntry(p,uVar1);
    if (4 < iVar7) {
      iVar7 = Abc_Lit2Var(uVar1);
      pGVar5 = Gia_ManObj(pGia,iVar7);
      iVar7 = Abc_Lit2Var(uVar1);
      if ((uVar1 & 1) == 0) {
        Vec_IntWriteEntry(pVVar4,iVar7,1);
        iVar7 = Gia_ObjIsPi(pGia,pGVar5);
        local_48 = local_48 + iVar7;
        local_4c = local_4c + 1;
      }
      else {
        Vec_IntWriteEntry(pVVar4,iVar7,0);
        iVar7 = Gia_ObjIsPi(pGia,pGVar5);
        uVar8 = uVar8 + iVar7;
        local_44 = local_44 + 1;
      }
    }
  }
  Vec_IntFree(p);
  pStr = (char *)(ulong)local_44;
  printf("Logic0 = %d (%d). Logic1 = %d (%d). ",pStr,(ulong)uVar8,(ulong)local_4c,(ulong)local_48);
  aVar6 = Abc_Clock();
  Abc_PrintTime((int)aVar6 - (int)aVar3,pStr,time);
  return pVVar4;
}

Assistant:

Vec_Int_t * Gia_ManSimDeriveResets( Gia_Man_t * pGia )
{
    int nImpLimit = 5;
    Vec_Int_t * vResult;
    Vec_Int_t * vCountLits, * vSuperGate;
    Gia_Obj_t * pObj;
    int i, k, Lit, Count;
    int Counter0 = 0, Counter1 = 0;
    int CounterPi0 = 0, CounterPi1 = 0;
    abctime clk = Abc_Clock();

    // create reset counters for each literal
    vCountLits = Vec_IntStart( 2 * Gia_ManObjNum(pGia) );

    // collect implications for each flop input driver
    vSuperGate = Vec_IntAlloc( 1000 );
    Gia_ManForEachRi( pGia, pObj, i )
    {
        if ( Gia_ObjFaninId0p(pGia, pObj) == 0 )
            continue;
        Vec_IntAddToEntry( vCountLits, Gia_ObjToLit(pGia, Gia_ObjChild0(pObj)), 1 );
        Gia_ManSimCollect( pGia, Gia_ObjFanin0(pObj), vSuperGate );
        Vec_IntForEachEntry( vSuperGate, Lit, k )
            Vec_IntAddToEntry( vCountLits, Lit, 1 );
    }
    Vec_IntFree( vSuperGate );

    // label signals whose counter if more than the limit
    vResult = Vec_IntStartFull( Gia_ManObjNum(pGia) );
    Vec_IntForEachEntry( vCountLits, Count, Lit )
    {
        if ( Count < nImpLimit )
            continue;
        pObj = Gia_ManObj( pGia, Abc_Lit2Var(Lit) );
        if ( Abc_LitIsCompl(Lit) ) // const 0
        {
//            Ssm_ObjSetLogic0( pObj );
            Vec_IntWriteEntry( vResult, Abc_Lit2Var(Lit), 0 );
            CounterPi0 += Gia_ObjIsPi(pGia, pObj);
            Counter0++;
        }
        else
        {
//            Ssm_ObjSetLogic1( pObj );
            Vec_IntWriteEntry( vResult, Abc_Lit2Var(Lit), 1 );
            CounterPi1 += Gia_ObjIsPi(pGia, pObj);
            Counter1++;
        }
//        if ( Gia_ObjIsPi(pGia, pObj) )
//            printf( "%d ", Count );
    }
//    printf( "\n" );
    Vec_IntFree( vCountLits );

    printf( "Logic0 = %d (%d). Logic1 = %d (%d). ", Counter0, CounterPi0, Counter1, CounterPi1 );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return vResult;
}